

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderCustomData.cpp
# Opt level: O0

bool Assimp::Blender::read<Assimp::Blender::MTFace>
               (Structure *s,MTFace *p,size_t cnt,FileDatabase *db)

{
  undefined1 local_68 [8];
  MTFace read;
  size_t i;
  FileDatabase *db_local;
  size_t cnt_local;
  MTFace *p_local;
  Structure *s_local;
  
  read.flag = '\0';
  read._49_1_ = 0;
  read.mode = 0;
  read.tile = 0;
  read.unwrap = 0;
  cnt_local = (size_t)p;
  for (; (ulong)read._48_8_ < cnt; read._48_8_ = read._48_8_ + 1) {
    MTFace::MTFace((MTFace *)local_68);
    Structure::Convert<Assimp::Blender::MTFace>(s,(MTFace *)local_68,db);
    MTFace::operator=((MTFace *)cnt_local,(MTFace *)local_68);
    cnt_local = cnt_local + 0x38;
    MTFace::~MTFace((MTFace *)local_68);
  }
  return true;
}

Assistant:

bool read(const Structure &s, T *p, const size_t cnt, const FileDatabase &db) {
            for (size_t i = 0; i < cnt; ++i) {
                T read;
                s.Convert(read, db);
                *p = read;
                p++;
            }
            return true;
        }